

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O3

int Sdb_StoPrepareSet(Sdb_Sto_t *p,int iObj,int Index)

{
  Sdb_Cut_t *pSVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  if ((iObj < 0) || (p->vCuts->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  piVar2 = p->vCuts->pArray[(uint)iObj].pArray;
  iVar4 = *piVar2;
  if (0 < iVar4) {
    piVar6 = piVar2 + 1;
    piVar3 = p->pCuts[(uint)Index][0].pLeaves;
    lVar7 = 0;
    do {
      pSVar1 = p->pCuts[(uint)Index] + lVar7;
      uVar8 = *(uint *)&p->pCuts[(uint)Index][lVar7].field_0x14 & 0xfffffff | *piVar6 << 0x1c;
      *(uint *)&p->pCuts[(uint)Index][lVar7].field_0x14 = uVar8;
      iVar4 = *piVar6;
      if (0 < iVar4) {
        lVar9 = 0;
        do {
          piVar3[lVar9] = piVar6[lVar9 + 1];
          iVar4 = *piVar6;
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar4);
        uVar8 = *(uint *)&pSVar1->field_0x14;
      }
      pSVar1->iFunc = piVar6[(long)iVar4 + 1];
      if (uVar8 < 0x10000000) {
        pSVar1->Sign = 0;
        uVar5 = 0;
      }
      else {
        uVar11 = 0;
        uVar10 = 0;
        do {
          uVar10 = uVar10 | 1L << ((ulong)(byte)piVar3[uVar11] & 0x3f);
          uVar11 = uVar11 + 1;
        } while (uVar8 >> 0x1c != uVar11);
        pSVar1->Sign = uVar10;
        uVar10 = 0;
        uVar5 = 0;
        do {
          iVar4 = piVar3[uVar10];
          if (((long)iVar4 < 0) || (p->vRefs->nSize <= iVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar5 = uVar5 + (p->vRefs->pArray[iVar4] == 1);
          uVar10 = uVar10 + 1;
        } while (uVar8 >> 0x1c != uVar10);
        uVar5 = uVar5 & 0xfffffff;
      }
      *(uint *)&pSVar1->field_0x14 = uVar8 & 0xf0000000 | uVar5;
      lVar7 = lVar7 + 1;
      piVar6 = piVar6 + (long)*piVar6 + 2;
      iVar4 = *piVar2;
      piVar3 = piVar3 + 0xc;
    } while (lVar7 < iVar4);
  }
  return iVar4;
}

Assistant:

static inline int Sdb_StoPrepareSet( Sdb_Sto_t * p, int iObj, int Index )
{
    Vec_Int_t * vThis = Vec_WecEntry( p->vCuts, iObj );
    int i, v, * pCut, * pList = Vec_IntArray( vThis );
    Sdb_ForEachCut( pList, pCut, i )
    {
        Sdb_Cut_t * pCutTemp = &p->pCuts[Index][i];
        pCutTemp->nLeaves = pCut[0];
        for ( v = 1; v <= pCut[0]; v++ )
            pCutTemp->pLeaves[v-1] = pCut[v];
        pCutTemp->iFunc = pCut[pCut[0]+1];
        pCutTemp->Sign = Sdb_CutGetSign( pCutTemp );
        pCutTemp->nTreeLeaves = Sdb_CutTreeLeaves( p, pCutTemp );
    }
    return pList[0];
}